

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::GcAwakeTransientWindowBuffers(ImGuiWindow_conflict *window)

{
  int *piVar1;
  wchar_t wVar2;
  int iVar3;
  ImWchar *pIVar4;
  ImDrawVert *pIVar5;
  ImWchar *__dest;
  ImDrawVert *__dest_00;
  ImDrawList *pIVar6;
  
  window->MemoryCompacted = false;
  pIVar6 = window->DrawList;
  wVar2 = window->MemoryDrawListIdxCapacity;
  if ((pIVar6->IdxBuffer).Capacity < wVar2) {
    if (GImGui != (ImGuiContext_conflict1 *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (ImWchar *)(*GImAllocatorAllocFunc)((long)wVar2 * 2,GImAllocatorUserData);
    pIVar4 = (pIVar6->IdxBuffer).Data;
    if (pIVar4 != (ImWchar *)0x0) {
      memcpy(__dest,pIVar4,(long)(pIVar6->IdxBuffer).Size * 2);
      pIVar4 = (pIVar6->IdxBuffer).Data;
      if ((pIVar4 != (ImWchar *)0x0) && (GImGui != (ImGuiContext_conflict1 *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
    }
    (pIVar6->IdxBuffer).Data = __dest;
    (pIVar6->IdxBuffer).Capacity = wVar2;
    pIVar6 = window->DrawList;
  }
  iVar3 = window->MemoryDrawListVtxCapacity;
  if ((pIVar6->VtxBuffer).Capacity < iVar3) {
    if (GImGui != (ImGuiContext_conflict1 *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest_00 = (ImDrawVert *)(*GImAllocatorAllocFunc)((long)iVar3 * 0x14,GImAllocatorUserData);
    pIVar5 = (pIVar6->VtxBuffer).Data;
    if (pIVar5 != (ImDrawVert *)0x0) {
      memcpy(__dest_00,pIVar5,(long)(pIVar6->VtxBuffer).Size * 0x14);
      pIVar5 = (pIVar6->VtxBuffer).Data;
      if ((pIVar5 != (ImDrawVert *)0x0) && (GImGui != (ImGuiContext_conflict1 *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
    }
    (pIVar6->VtxBuffer).Data = __dest_00;
    (pIVar6->VtxBuffer).Capacity = iVar3;
  }
  window->MemoryDrawListIdxCapacity = 0;
  window->MemoryDrawListVtxCapacity = 0;
  return;
}

Assistant:

void ImGui::GcAwakeTransientWindowBuffers(ImGuiWindow* window)
{
    // We stored capacity of the ImDrawList buffer to reduce growth-caused allocation/copy when awakening.
    // The other buffers tends to amortize much faster.
    window->MemoryCompacted = false;
    window->DrawList->IdxBuffer.reserve(window->MemoryDrawListIdxCapacity);
    window->DrawList->VtxBuffer.reserve(window->MemoryDrawListVtxCapacity);
    window->MemoryDrawListIdxCapacity = window->MemoryDrawListVtxCapacity = 0;
}